

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O3

void __thiscall
entityx::EventManager::subscribe<entityx::ComponentAddedEvent<A>,entityx::deps::Dependency<A,B,C>>
          (EventManager *this,Dependency<A,_B,_C> *receiver)

{
  _Atomic_word *p_Var1;
  ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Atomic_word _Var2;
  Family id;
  EventSignalPtr *pEVar3;
  size_t sVar4;
  EventCallbackWrapper<entityx::ComponentAddedEvent<A>_> wrapper;
  _Any_data local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  size_t local_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_40;
  code *local_30;
  
  id = Event<entityx::ComponentAddedEvent<A>_>::family();
  pEVar3 = signal_for(this,id);
  this_00 = &((pEVar3->
              super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->
             super_ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>;
  this_01 = (pEVar3->
            super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = operator_new(0x18);
  *(code **)local_68._M_unused._0_8_ = deps::Dependency<A,_B,_C>::receive;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
  *(Dependency<A,_B,_C> **)((long)local_68._M_unused._0_8_ + 0x10) = receiver;
  pcStack_50 = Catch::clara::std::
               _Function_handler<void_(const_entityx::ComponentAddedEvent<A>_&),_std::_Bind<void_(entityx::deps::Dependency<A,_B,_C>::*(entityx::deps::Dependency<A,_B,_C>_*,_std::_Placeholder<1>))(const_entityx::ComponentAddedEvent<A>_&)>_>
               ::_M_invoke;
  local_58 = Catch::clara::std::
             _Function_handler<void_(const_entityx::ComponentAddedEvent<A>_&),_std::_Bind<void_(entityx::deps::Dependency<A,_B,_C>::*(entityx::deps::Dependency<A,_B,_C>_*,_std::_Placeholder<1>))(const_entityx::ComponentAddedEvent<A>_&)>_>
             ::_M_manager;
  Catch::clara::std::function<void_(const_entityx::ComponentAddedEvent<A>_&)>::function
            ((function<void_(const_entityx::ComponentAddedEvent<A>_&)> *)&local_40,
             (function<void_(const_entityx::ComponentAddedEvent<A>_&)> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  std::function<void(void_const*)>::
  function<entityx::EventManager::EventCallbackWrapper<entityx::ComponentAddedEvent<A>>&,void>
            ((function<void(void_const*)> *)local_88._M_pod_data,
             (EventCallbackWrapper<entityx::ComponentAddedEvent<A>_> *)&local_40);
  Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::ensure_ring
            (this_00);
  sVar4 = Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::
          SignalLink::add_before(this_00->callback_ring_,(CbFunction *)&local_88);
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)local_78)(&local_88,&local_88,__destroy_functor);
  }
  local_88._M_unused._M_member_pointer = Event<entityx::ComponentAddedEvent<A>_>::family();
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_weak_count = this_01->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_weak_count = this_01->_M_weak_count + 1;
    }
  }
  local_88._8_8_ = this_00;
  local_78 = this_01;
  local_70 = sVar4;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<unsigned_long,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&(receiver->super_Receiver<entityx::deps::Dependency<A,_B,_C>_>).super_BaseReceiver.
                 connections_);
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &local_78->_M_weak_count;
      _Var2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      _Var2 = local_78->_M_weak_count;
      local_78->_M_weak_count = _Var2 + -1;
    }
    if (_Var2 == 1) {
      (*local_78->_vptr__Sp_counted_base[3])();
    }
  }
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void subscribe(Receiver &receiver) {
    void (Receiver::*receive)(const E &) = &Receiver::receive;
    auto sig = signal_for(Event<E>::family());
    auto wrapper = EventCallbackWrapper<E>(std::bind(receive, &receiver, std::placeholders::_1));
    auto connection = sig->connect(wrapper);
    BaseReceiver &base = receiver;
    base.connections_.insert(std::make_pair(Event<E>::family(), std::make_pair(EventSignalWeakPtr(sig), connection)));
  }